

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_example.cxx
# Opt level: O1

void test_basic_usage<ThreadSafeBase>(void)

{
  String *pSVar1;
  retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_> rVar2;
  bool bVar3;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  TPtr ptr2;
  TPtr pt3;
  TPtr ptr;
  ResultBuilder _DOCTEST_RB;
  retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_> local_b0;
  __atomic_base<long> local_a8;
  Expression_lhs<long_const&> local_a0 [8];
  String local_98;
  __atomic_base<long> local_90;
  retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_> local_88;
  ResultBuilder local_80;
  __atomic_base<long> local_40;
  undefined4 local_34;
  
  local_88.ptr = (pointer)operator_new(8);
  instance_counted<ThreadSafeBase>::numInstances =
       instance_counted<ThreadSafeBase>::numInstances + 1;
  ((local_88.ptr)->super_atomic_reference_count<ThreadSafeBase>).count.super___atomic_base<long>.
  _M_i = 1;
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x23,"T::numInstances == 1","");
    local_b0.ptr = (pointer)&instance_counted<ThreadSafeBase>::numInstances;
    local_a8._M_i._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_b0);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
  } while (bVar3);
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x24,"ptr.use_count() == 1","");
    if (local_88.ptr == (pointer)0x0) {
      local_a8._M_i = 0;
    }
    else {
      local_a8._M_i =
           ((local_88.ptr)->super_atomic_reference_count<ThreadSafeBase>).count.
           super___atomic_base<long>._M_i;
    }
    local_90._M_i._0_4_ = 1;
    local_b0.ptr = (pointer)&local_a8;
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_b0);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x_00);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
  } while (bVar3);
  local_b0.ptr = local_88.ptr;
  if (local_88.ptr != (pointer)0x0) {
    LOCK();
    ((local_88.ptr)->super_atomic_reference_count<ThreadSafeBase>).count.super___atomic_base<long>.
    _M_i = ((local_88.ptr)->super_atomic_reference_count<ThreadSafeBase>).count.
           super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x27,"T::numInstances == 1","");
    local_a8._M_i = (__int_type)&instance_counted<ThreadSafeBase>::numInstances;
    local_90._M_i._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_a8);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x_01);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
  } while (bVar3);
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x28,"ptr.use_count() == 2","");
    if (local_88.ptr == (pointer)0x0) {
      local_90._M_i = 0;
    }
    else {
      local_90._M_i =
           ((local_88.ptr)->super_atomic_reference_count<ThreadSafeBase>).count.
           super___atomic_base<long>._M_i;
    }
    local_40._M_i._0_4_ = 2;
    local_a8._M_i = (__int_type)&local_90;
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_a8);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x_02);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
    rVar2.ptr = local_b0.ptr;
  } while (bVar3);
  local_b0.ptr = (pointer)0x0;
  local_a8._M_i = (__int_type)rVar2.ptr;
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2a,"T::numInstances == 1","");
    local_90._M_i = (__int_type)&instance_counted<ThreadSafeBase>::numInstances;
    local_40._M_i._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_90);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x_03);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
  } while (bVar3);
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2b,"ptr.use_count() == 2","");
    if (local_88.ptr == (pointer)0x0) {
      local_40._M_i = 0;
    }
    else {
      local_40._M_i =
           ((local_88.ptr)->super_atomic_reference_count<ThreadSafeBase>).count.
           super___atomic_base<long>._M_i;
    }
    local_34 = 2;
    local_90._M_i = (__int_type)&local_40;
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_90);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x_04);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
  } while (bVar3);
  sg14::retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_>::~retain_ptr
            ((retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_> *)&local_a8);
  sg14::retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_>::~retain_ptr(&local_b0);
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2d,"T::numInstances == 1","");
    local_b0.ptr = (pointer)&instance_counted<ThreadSafeBase>::numInstances;
    local_a8._M_i._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_b0);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x_05);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
  } while (bVar3);
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2e,"ptr.use_count() == 1","");
    if (local_88.ptr == (pointer)0x0) {
      local_a8._M_i = 0;
    }
    else {
      local_a8._M_i =
           ((local_88.ptr)->super_atomic_reference_count<ThreadSafeBase>).count.
           super___atomic_base<long>._M_i;
    }
    local_b0.ptr = (pointer)&local_a8;
    local_90._M_i._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_b0);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x_06);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
  } while (bVar3);
  sg14::retain_ptr<ThreadSafeBase,_sg14::retain_traits<ThreadSafeBase>_>::~retain_ptr(&local_88);
  pSVar1 = &local_80.m_result.m_decomposition;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_80,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x30,"T::numInstances == 0","");
    local_88.ptr = (pointer)&instance_counted<ThreadSafeBase>::numInstances;
    local_b0.ptr = (pointer)((ulong)local_b0.ptr & 0xffffffff00000000);
    doctest::detail::Expression_lhs<long_const&>::operator==(local_a0,(int *)&local_88);
    local_80.m_result.m_passed = (bool)local_a0[0];
    doctest::String::operator=(pSVar1,&local_98);
    doctest::String::~String(&local_98);
    doctest::detail::ResultBuilder::log(&local_80,__x_07);
    doctest::detail::ResultBuilder::react(&local_80);
    doctest::String::~String(pSVar1);
    bVar3 = doctest::detail::always_false();
  } while (bVar3);
  return;
}

Assistant:

void test_basic_usage()
{
  using TPtr = sg14::retain_ptr<T>;
  {
    TPtr ptr{new T};
    REQUIRE(T::numInstances == 1);
    REQUIRE(ptr.use_count() == 1);
    {
      TPtr ptr2{ptr};
      REQUIRE(T::numInstances == 1);
      REQUIRE(ptr.use_count() == 2);
      TPtr pt3{std::move(ptr2)};
      REQUIRE(T::numInstances == 1);
      REQUIRE(ptr.use_count() == 2);
    }
    REQUIRE(T::numInstances == 1);
    REQUIRE(ptr.use_count() == 1);
  }
  REQUIRE(T::numInstances == 0);
}